

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O0

int llbuild::basic::sys::chdir(char *__path)

{
  int iVar1;
  char *fileName_local;
  
  iVar1 = ::chdir(__path);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

bool sys::chdir(const char *fileName) {
#if defined(_WIN32)
  llvm::SmallVector<llvm::UTF16, 20> wFileName;
  llvm::convertUTF8ToUTF16String(fileName, wFileName);
  return SetCurrentDirectoryW((LPCWSTR)wFileName.data());
#else
  return ::chdir(fileName) == 0;
#endif
}